

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xml_generator.cc
# Opt level: O3

string * __thiscall
t_xml_generator::number_to_string<int>(string *__return_storage_ptr__,t_xml_generator *this,int t)

{
  ostringstream out;
  locale alStack_198 [8];
  long local_190;
  undefined8 local_188 [13];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  std::locale::classic();
  std::ios::imbue(alStack_198);
  std::locale::~locale(alStack_198);
  *(undefined8 *)((long)local_188 + *(long *)(local_190 + -0x18)) = 9;
  std::ostream::operator<<(&local_190,t);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

string number_to_string(T t) {
    std::ostringstream out;
    out.imbue(std::locale::classic());
    out.precision(std::numeric_limits<T>::digits10);
    out << t;
    return out.str();
  }